

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O2

exr_result_t
internal_huf_decompress
          (exr_decode_pipeline_t *decode,uint8_t *compressed,uint64_t nCompressed,uint16_t *raw,
          uint64_t nRaw,void *spare,uint64_t sparebytes)

{
  void *pvVar1;
  uint16_t *puVar2;
  uint16_t uVar3;
  uint uVar4;
  uint8_t *puVar5;
  byte bVar6;
  char cVar7;
  int i;
  int iVar8;
  int iVar9;
  long lVar10;
  uint64_t uVar11;
  void *pvVar12;
  void *pvVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  exr_const_context_t p_Var18;
  char *pcVar19;
  long lVar20;
  ulong uVar21;
  code *pcVar22;
  uint uVar23;
  byte *pbVar24;
  long lVar25;
  uint16_t *puVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  byte *pbVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  double dVar34;
  long alStack_40998 [32817];
  uint local_80c;
  int currBitCount;
  ulong local_7f8;
  uint8_t *currByte;
  uint16_t *local_7e8;
  uint16_t *local_7e0;
  byte *local_7d8;
  uint64_t currBits;
  exr_memory_free_func_t local_7c8;
  byte *local_7c0;
  ulong local_7b8;
  ulong local_7b0;
  uint64_t offset [59];
  size_t codeCount [59];
  uint64_t base [59];
  uint8_t *local_208 [59];
  
  if (decode == (exr_decode_pipeline_t *)0x0) {
    p_Var18 = (exr_const_context_t)0x0;
  }
  else {
    p_Var18 = decode->context;
  }
  if (nCompressed < 0x14) {
    return (uint)(nRaw != 0) * 3;
  }
  if (sparebytes != 0xc0008) {
    return 3;
  }
  uVar15 = *(uint *)compressed;
  uVar31 = (ulong)uVar15;
  local_7f8 = (ulong)*(uint *)(compressed + 4);
  if (0x10000 < local_7f8 || 0x10000 < uVar31) {
    return 0x17;
  }
  local_7b8 = (ulong)*(uint *)(compressed + 0xc);
  local_7d8 = (byte *)(local_7b8 + 7 >> 3);
  if (nCompressed < local_7d8 + 0x14) {
    return 1;
  }
  pbVar24 = compressed + 0x14;
  local_7e8 = (uint16_t *)nRaw;
  local_7e0 = raw;
  local_7b0 = uVar31;
  if (0x80 < *(uint *)(compressed + 0xc)) {
    currBits = 0;
    currBitCount = 0;
    *(uint *)spare = *(uint *)(compressed + 4);
    *(undefined4 *)((long)spare + 4) = 0;
    *(undefined2 *)((long)spare + 8) = 0xff;
    for (lVar10 = 0; lVar10 != 0x3b; lVar10 = lVar10 + 1) {
      codeCount[lVar10] = 0;
      base[lVar10] = 0xffffffffffffffff;
      offset[lVar10] = 0;
    }
    bVar14 = 0xff;
    uVar27 = 0;
    currByte = pbVar24;
    local_7c8 = (exr_memory_free_func_t)compressed;
    local_7c0 = pbVar24;
    while( true ) {
      uVar21 = (ulong)bVar14;
      uVar32 = uVar27 & 0xff;
      if (local_7f8 < uVar31) break;
      if (compressed + nCompressed <= currByte) {
LAB_0010bf6a:
        if (p_Var18 == (exr_const_context_t)0x0) {
          return 0x17;
        }
        pcVar19 = "Error decoding Huffman table (Truncated table data).";
        goto LAB_0010bfc4;
      }
      uVar11 = fasthuf_read_bits(6,&currBits,&currBitCount,&currByte);
      uVar15 = (uint)uVar11;
      if (uVar11 < 0x3b) {
        if (uVar11 != 0) {
          bVar6 = (byte)uVar11;
          if (uVar15 < bVar14) {
            *(byte *)((long)spare + 8) = bVar6;
            bVar14 = bVar6;
          }
          if ((uint)uVar32 < uVar15) {
            *(byte *)((long)spare + 9) = bVar6;
            uVar27 = uVar11 & 0xffffffff;
          }
          codeCount[uVar11] = codeCount[uVar11] + 1;
          goto LAB_0010bf0f;
        }
      }
      else {
        if (uVar15 == 0x3f) {
          if (compressed + nCompressed <= currByte) goto LAB_0010bf6a;
          uVar11 = fasthuf_read_bits(8,&currBits,&currBitCount,&currByte);
          uVar31 = uVar31 + uVar11 + 5;
        }
        else {
          uVar31 = (uVar31 + uVar11) - 0x3a;
        }
LAB_0010bf0f:
        if (local_7f8 < uVar31) {
          if (p_Var18 == (exr_const_context_t)0x0) {
            return 0x17;
          }
          pcVar19 = "Error decoding Huffman table (Run beyond end of table).";
          goto LAB_0010bfc4;
        }
      }
      uVar31 = uVar31 + 1;
    }
    uVar15 = 0;
    for (lVar10 = 0; lVar10 != 0x3a; lVar10 = lVar10 + 1) {
      uVar15 = uVar15 + (int)codeCount[lVar10];
    }
    *(uint *)((long)spare + 4) = uVar15;
    if (uVar15 < 0x10002) {
      lVar10 = uVar32 - uVar21;
      for (uVar31 = uVar21; uVar28 = uVar21, uVar31 <= uVar32; uVar31 = uVar31 + 1) {
        offset[uVar31] =
             (uint64_t)
             ((double)(2L << ((byte)lVar10 & 0x3f)) *
             (((double)CONCAT44(0x45300000,(int)(codeCount[uVar31] >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)codeCount[uVar31]) - 4503599627370496.0)));
        lVar10 = lVar10 + -1;
      }
      while (uVar28 <= uVar32) {
        dVar34 = 0.0;
        for (uVar31 = uVar28 + 1; uVar31 <= uVar32; uVar31 = uVar31 + 1) {
          dVar34 = dVar34 + (double)offset[uVar31];
        }
        dVar34 = ceil(dVar34 / (double)(2L << ((char)uVar27 - (char)uVar28 & 0x3fU)));
        base[uVar28] = (long)(dVar34 - 9.223372036854776e+18) & (long)dVar34 >> 0x3f | (long)dVar34;
        uVar28 = uVar28 + 1;
      }
      uVar11 = 0;
      for (uVar31 = uVar32; offset[uVar31] = uVar11, (long)uVar21 < (long)uVar31;
          uVar31 = uVar31 - 1) {
        uVar11 = uVar11 + codeCount[uVar31];
      }
      for (lVar10 = 0; uVar31 = uVar21, lVar10 != 0x3b; lVar10 = lVar10 + 1) {
        local_208[lVar10] = (uint8_t *)0xffffffffffffffff;
      }
      for (; uVar31 <= uVar32; uVar31 = uVar31 + 1) {
        local_208[uVar31] = (uint8_t *)offset[uVar31];
      }
      currBits = 0;
      currBitCount = 0;
      currByte = local_7c0;
      for (uVar31 = local_7b0; uVar31 <= local_7f8; uVar31 = uVar31 + 1) {
        uVar11 = fasthuf_read_bits(6,&currBits,&currBitCount,&currByte);
        if (uVar11 < 0x3b) {
          if (uVar11 != 0) {
            puVar5 = local_208[uVar11];
            if ((uint8_t *)(ulong)*(uint *)((long)spare + 4) <= puVar5) {
              if (p_Var18 == (exr_const_context_t)0x0) {
                return 0x17;
              }
              pcVar19 = "Huffman decode error (Invalid symbol in header)";
              goto LAB_0010bfc4;
            }
            *(int *)((long)spare + (long)puVar5 * 4 + 0xc) = (int)uVar31;
            local_208[uVar11] = puVar5 + 1;
          }
        }
        else if ((int)uVar11 == 0x3f) {
          uVar11 = fasthuf_read_bits(8,&currBits,&currBitCount,&currByte);
          uVar31 = uVar31 + uVar11 + 5;
        }
        else {
          uVar31 = (uVar31 + uVar11) - 0x3a;
        }
      }
      lVar20 = 0;
      for (lVar10 = 0x40; lVar10 != 5; lVar10 = lVar10 + -1) {
        lVar25 = *(long *)((long)base + lVar20) << ((byte)lVar10 & 0x3f);
        if (*(long *)((long)base + lVar20) == -1) {
          lVar25 = -1;
        }
        *(long *)((long)spare + lVar20 + 0x40010) = lVar25;
        lVar20 = lVar20 + 8;
      }
      *(undefined8 *)((long)spare + 0x401e8) = 0;
      uVar31 = *(ulong *)((long)spare + 0x40010);
      *(uint64_t *)((long)spare + 0x401f0) = offset[0] - uVar31;
      lVar20 = 0x803f;
      for (lVar10 = 0x3f; lVar10 != 5; lVar10 = lVar10 + -1) {
        *(ulong *)((long)spare + lVar20 * 8) =
             alStack_40998[lVar20] -
             (*(ulong *)((long)spare + lVar20 * 8 + -0x1e0) >> ((byte)lVar10 & 0x3f));
        lVar20 = lVar20 + 1;
      }
      for (lVar10 = 0; lVar10 != 0x1000; lVar10 = lVar10 + 1) {
        *(undefined4 *)((long)spare + lVar10 * 4 + 0x403c8) = 0xffff;
        *(undefined1 *)((long)spare + lVar10 + 0x443c8) = 0;
        for (uVar27 = uVar21; uVar27 <= uVar32; uVar27 = uVar27 + 1) {
          if (*(ulong *)((long)spare + uVar27 * 8 + 0x40010) <= (ulong)(lVar10 << 0x34)) {
            *(char *)((long)spare + lVar10 + 0x443c8) = (char)uVar27;
            uVar27 = ((ulong)(lVar10 << 0x34) >> (-(char)uVar27 & 0x3fU)) +
                     *(long *)((long)spare + uVar27 * 8 + 0x401f0);
            if (*(uint *)((long)spare + 4) <= uVar27) {
              if (p_Var18 == (exr_const_context_t)0x0) {
                return 0x17;
              }
              pcVar19 = "Huffman decode error (Overrun)";
              goto LAB_0010bfc4;
            }
            *(undefined4 *)((long)spare + lVar10 * 4 + 0x403c8) =
                 *(undefined4 *)((long)spare + uVar27 * 4 + 0xc);
            break;
          }
        }
      }
      uVar27 = 0xc;
      uVar15 = 0xc;
      do {
        bVar33 = uVar15 == 0;
        uVar15 = uVar15 - 1;
        uVar21 = uVar31;
        if (bVar33) break;
        uVar21 = *(ulong *)((long)spare + uVar27 * 8 + 0x40010);
        uVar27 = (ulong)uVar15;
      } while (uVar21 == 0xffffffffffffffff);
      *(ulong *)((long)spare + 0x453c8) = uVar21;
      if (nCompressed < currByte + ((long)local_7d8 - (long)local_7c8)) {
        return 1;
      }
      local_208[0] = currByte + 0x10;
      base[0] = local_7b8 - 0x80;
      uVar31 = *(ulong *)currByte;
      offset[0] = uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
                  (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
                  (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 |
                  (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38;
      uVar31 = *(ulong *)(currByte + 8);
      codeCount[0] = uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
                     (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
                     (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 |
                     (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38;
      currByte = (uint8_t *)CONCAT44(currByte._4_4_,0x40);
      iVar9 = *spare;
      uVar15 = 0x40;
      uVar31 = 0;
      while (uVar31 < local_7e8) {
        if (offset[0] < uVar21) {
          if (uVar15 < 0x40) {
            FastHufDecoder_refill(offset,uVar15,codeCount,(int *)&currByte,local_208,base);
            uVar15 = 0x40;
          }
          lVar10 = -0x34;
          do {
            lVar20 = lVar10;
            lVar10 = lVar20 + 1;
          } while (offset[0] < *(ulong *)((long)spare + lVar20 * 8 + 0x40218));
          uVar27 = lVar20 + 0x41;
          if ((uVar32 < uVar27) ||
             (uVar28 = (offset[0] >> (-(char)lVar10 & 0x3fU)) +
                       *(long *)((long)spare + lVar10 * 8 + 0x403f0),
             *(uint *)((long)spare + 4) <= uVar28)) {
            if (p_Var18 == (exr_const_context_t)0x0) {
              return 0x17;
            }
            pcVar19 = "Huffman decode error (Decoded an invalid symbol)";
            goto LAB_0010c9ce;
          }
          lVar10 = uVar28 * 4 + 0xc;
        }
        else {
          uVar27 = (ulong)*(byte *)((long)spare + (offset[0] >> 0x34) + 0x443c8);
          lVar10 = (offset[0] >> 0x34) * 4 + 0x403c8;
        }
        offset[0] = offset[0] << ((byte)uVar27 & 0x3f);
        uVar15 = uVar15 - (int)uVar27;
        if (*(int *)((long)spare + lVar10) == iVar9) {
          if ((int)uVar15 < 8) {
            FastHufDecoder_refill(offset,uVar15,codeCount,(int *)&currByte,local_208,base);
            uVar15 = 0x40;
          }
          if (uVar31 == 0) {
            if (p_Var18 == (exr_const_context_t)0x0) {
              return 0x17;
            }
            pcVar19 = "Huffman decode error (RLE code with no previous symbol)";
LAB_0010c9ce:
            (*p_Var18->print_error)(p_Var18,0x17,pcVar19);
            return 0x17;
          }
          uVar28 = offset[0] >> 0x38;
          uVar27 = uVar28 + uVar31;
          if (local_7e8 < uVar27) {
            if (p_Var18 == (exr_const_context_t)0x0) {
              return 0x17;
            }
            pcVar19 = "Huffman decode error (Symbol run beyond expected output buffer length)";
            goto LAB_0010c9ce;
          }
          if (uVar28 == 0) {
            if (p_Var18 == (exr_const_context_t)0x0) {
              return 0x17;
            }
            pcVar19 = "Huffman decode error (Invalid RLE length)";
            goto LAB_0010c9ce;
          }
          for (uVar29 = 0; uVar28 != uVar29; uVar29 = uVar29 + 1) {
            local_7e0[uVar31 + uVar29] = local_7e0[uVar31 - 1];
          }
          offset[0] = offset[0] << 8;
          uVar15 = uVar15 - 8;
        }
        else {
          local_7e0[uVar31] = (uint16_t)*(int *)((long)spare + lVar10);
          uVar27 = uVar31 + 1;
        }
        uVar31 = uVar27;
        if ((int)uVar15 < 0xc) {
          FastHufDecoder_refill(offset,uVar15,codeCount,(int *)&currByte,local_208,base);
          uVar15 = 0x40;
        }
      }
      if (base[0] == 0) {
        return 0;
      }
      if (p_Var18 != (exr_const_context_t)0x0) {
        (*p_Var18->print_error)
                  (p_Var18,0x17,
                   "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)"
                  );
        return 0x17;
      }
    }
    else if (p_Var18 != (exr_const_context_t)0x0) {
      pcVar19 = "Error decoding Huffman table (Too many symbols).";
LAB_0010bfc4:
      (*p_Var18->print_error)(p_Var18,0x17,pcVar19);
    }
    return 0x17;
  }
  pvVar1 = (void *)((long)spare + 0x80008);
  pbVar30 = (byte *)(nCompressed - 0x14);
  memset(pvVar1,0,0x40000);
  offset[0] = 0;
  codeCount[0] = (ulong)codeCount[0]._4_4_ << 0x20;
  base[0] = (uint64_t)pbVar24;
  memset(spare,0,0x80008);
  uVar31 = local_7f8 + 1;
  for (; local_7c0 = (byte *)base[0], uVar15 <= (uint)local_7f8; uVar15 = uVar15 + 1) {
    if (((uint)codeCount[0] < 6) &&
       (local_7c0 = pbVar24, pbVar30 <= (byte *)(base[0] - (long)pbVar24))) goto LAB_0010bf3b;
    uVar11 = getBits(6,offset,(uint32_t *)codeCount,(uint8_t **)base);
    uVar27 = (ulong)uVar15;
    *(uint64_t *)((long)spare + uVar27 * 8) = uVar11;
    if (uVar11 == 0x3f) {
      if ((((uint)codeCount[0] < 8) &&
          (local_7c0 = pbVar24, pbVar30 <= (byte *)(base[0] - (long)pbVar24))) ||
         (uVar11 = getBits(8,offset,(uint32_t *)codeCount,(uint8_t **)base), local_7c0 = pbVar24,
         uVar31 < uVar11 + uVar27 + 6)) goto LAB_0010bf3b;
      lVar10 = uVar11 + 6;
      while (bVar33 = lVar10 != 0, lVar10 = lVar10 + -1, bVar33) {
        uVar27 = (ulong)uVar15;
        uVar15 = uVar15 + 1;
        *(undefined8 *)((long)spare + uVar27 * 8) = 0;
      }
LAB_0010be49:
      uVar15 = uVar15 - 1;
    }
    else if (0x3a < (uint)uVar11) {
      local_7c0 = pbVar24;
      if ((uVar11 + uVar27) - 0x39 <= uVar31) {
        lVar10 = uVar11 - 0x39;
        while (bVar33 = lVar10 != 0, lVar10 = lVar10 + -1, bVar33) {
          uVar27 = (ulong)uVar15;
          uVar15 = uVar15 + 1;
          *(undefined8 *)((long)spare + uVar27 * 8) = 0;
        }
        goto LAB_0010be49;
      }
      goto LAB_0010bf3b;
    }
  }
  pbVar30 = pbVar24 + ((long)pbVar30 - base[0]);
  hufCanonicalCodeTable((uint64_t *)spare);
LAB_0010bf3b:
  if ((ulong)((long)pbVar30 << 3) < local_7b8) {
    return 0x17;
  }
  if (p_Var18 == (exr_const_context_t)0x0) {
    local_7c8 = internal_exr_free;
    pcVar22 = internal_exr_alloc;
  }
  else {
    pcVar22 = p_Var18->alloc_fn;
    local_7c8 = p_Var18->free_fn;
  }
  local_80c = 0x17;
  for (uVar31 = local_7b0; uVar31 <= local_7f8; uVar31 = uVar31 + 1) {
    uVar27 = *(ulong *)((long)spare + uVar31 * 8);
    uVar21 = uVar27 >> 6;
    if (uVar21 >> ((byte)uVar27 & 0x3f) != 0) goto LAB_0010c86d;
    uVar15 = (uint)uVar27 & 0x3f;
    if (uVar15 < 0xf) {
      if ((uVar27 & 0x3f) != 0) {
        bVar14 = 0xe - (char)uVar15;
        lVar20 = uVar21 << (bVar14 & 0x3f);
        for (lVar10 = 0; (1L << (bVar14 & 0x3f)) * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
          if ((*(int *)((long)pvVar1 + lVar10 + lVar20 * 0x10) != 0) ||
             (*(long *)((long)pvVar1 + lVar10 + lVar20 * 0x10 + 8) != 0)) goto LAB_0010c86d;
          *(uint *)((long)pvVar1 + lVar10 + lVar20 * 0x10) = uVar15;
          *(int *)((long)pvVar1 + lVar10 + lVar20 * 0x10 + 4) = (int)uVar31;
        }
      }
    }
    else {
      lVar10 = (uVar21 >> ((char)uVar15 - 0xeU & 0x3f)) * 0x10;
      if (*(int *)((long)pvVar1 + lVar10) != 0) goto LAB_0010c86d;
      uVar15 = *(int *)((long)pvVar1 + lVar10 + 4) + 1;
      *(uint *)((long)pvVar1 + lVar10 + 4) = uVar15;
      pvVar13 = *(void **)((long)pvVar1 + lVar10 + 8);
      if (pvVar13 == (void *)0x0) {
        pvVar13 = (*pcVar22)(4);
        *(void **)((long)pvVar1 + lVar10 + 8) = pvVar13;
      }
      else {
        pvVar12 = (*pcVar22)((ulong)uVar15 << 2);
        *(void **)((long)pvVar1 + lVar10 + 8) = pvVar12;
        if (pvVar12 != (void *)0x0) {
          for (uVar27 = 0; uVar27 < *(int *)((long)pvVar1 + lVar10 + 4) - 1; uVar27 = uVar27 + 1) {
            *(undefined4 *)((long)pvVar12 + uVar27 * 4) =
                 *(undefined4 *)((long)pvVar13 + uVar27 * 4);
          }
        }
        (*local_7c8)(pvVar13);
        pvVar13 = *(void **)((long)pvVar1 + lVar10 + 8);
      }
      if (pvVar13 == (void *)0x0) goto LAB_0010c866;
      *(int *)((long)pvVar13 + (ulong)(*(int *)((long)pvVar1 + lVar10 + 4) - 1) * 4) = (int)uVar31;
    }
  }
  puVar2 = local_7e0 + (long)local_7e8;
  local_7d8 = local_7d8 + (long)local_7c0;
  iVar9 = 0;
  uVar31 = 0;
  pbVar24 = local_7c0;
  puVar26 = local_7e0;
  while (pbVar24 < local_7d8) {
    bVar14 = *pbVar24;
    pbVar24 = pbVar24 + 1;
    uVar31 = uVar31 << 8 | (ulong)bVar14;
    iVar9 = iVar9 + 8;
    while (0xd < iVar9) {
      uVar27 = (ulong)(((uint)(uVar31 >> ((char)iVar9 - 0xeU & 0x3f)) & 0x3fff) << 4);
      iVar16 = *(int *)((long)pvVar1 + uVar27);
      if (iVar16 == 0) {
        lVar10 = *(long *)((long)pvVar1 + uVar27 + 8);
        local_7e8 = puVar2;
        if (lVar10 == 0) goto LAB_0010c86d;
        uVar15 = *(uint *)((long)pvVar1 + uVar27 + 4);
        uVar27 = 0;
        while( true ) {
          if (uVar27 == uVar15) goto LAB_0010c86d;
          uVar4 = *(uint *)(lVar10 + uVar27 * 4);
          uVar21 = *(ulong *)((long)spare + (ulong)uVar4 * 8);
          uVar17 = (uint)uVar21;
          uVar23 = uVar17 & 0x3f;
          for (; (iVar9 < (int)uVar23 && (pbVar24 < local_7d8)); pbVar24 = pbVar24 + 1) {
            uVar31 = uVar31 << 8 | (ulong)*pbVar24;
            iVar9 = iVar9 + 8;
          }
          if (((int)uVar23 <= iVar9) &&
             (uVar21 >> 6 ==
              (~(-1L << ((byte)uVar21 & 0x3f)) & uVar31 >> ((char)iVar9 - (char)uVar23 & 0x3fU))))
          break;
          uVar27 = uVar27 + 1;
        }
        iVar16 = iVar9 - (uVar17 & 0x3f);
        if (uVar4 == (uint)local_7f8) {
          if (iVar16 < 8) {
            if (local_7d8 <= pbVar24) goto LAB_0010c9e1;
            bVar14 = *pbVar24;
            pbVar24 = pbVar24 + 1;
            uVar31 = uVar31 << 8 | (ulong)bVar14;
            iVar16 = (iVar9 - (uVar17 & 0x3f)) + 8;
          }
          iVar9 = iVar16 + -8;
          uVar21 = uVar31 >> ((byte)iVar9 & 0x3f);
          if (puVar2 < puVar26 + (uVar21 & 0xff)) goto LAB_0010c86d;
          if (puVar26 + -1 < local_7e0) goto LAB_0010c9e1;
          uVar3 = puVar26[-1];
          while (cVar7 = (char)uVar21, uVar21 = (ulong)(byte)(cVar7 - 1), cVar7 != '\0') {
            *puVar26 = uVar3;
            puVar26 = puVar26 + 1;
          }
        }
        else {
          if (puVar2 <= puVar26) goto LAB_0010c86d;
          *puVar26 = (uint16_t)uVar4;
          puVar26 = puVar26 + 1;
          iVar9 = iVar16;
        }
        if (uVar15 == (uint)uVar27) goto LAB_0010c86d;
      }
      else {
        iVar8 = iVar9 - iVar16;
        if (iVar9 < iVar16) goto LAB_0010c86d;
        uVar15 = *(uint *)((long)pvVar1 + uVar27 + 4);
        if (uVar15 == (uint)local_7f8) {
          if (iVar8 < 8) {
            if (local_7d8 <= pbVar24) goto LAB_0010c866;
            bVar14 = *pbVar24;
            pbVar24 = pbVar24 + 1;
            uVar31 = uVar31 << 8 | (ulong)bVar14;
            iVar8 = iVar8 + 8;
          }
          iVar9 = iVar8 + -8;
          uVar27 = uVar31 >> ((byte)iVar9 & 0x3f);
          if (puVar2 < puVar26 + (uVar27 & 0xff)) goto LAB_0010c86d;
          if (puVar26 + -1 < local_7e0) goto LAB_0010c866;
          uVar3 = puVar26[-1];
          while (cVar7 = (char)uVar27, uVar27 = (ulong)(byte)(cVar7 - 1), cVar7 != '\0') {
            *puVar26 = uVar3;
            puVar26 = puVar26 + 1;
          }
        }
        else {
          if (puVar2 <= puVar26) goto LAB_0010c86d;
          *puVar26 = (uint16_t)uVar15;
          puVar26 = puVar26 + 1;
          iVar9 = iVar8;
        }
      }
    }
  }
  uVar15 = -(int)local_7b8 & 7;
  uVar31 = uVar31 >> (sbyte)uVar15;
  iVar9 = iVar9 - uVar15;
  while (0 < iVar9) {
    uVar27 = (ulong)(((uint)(uVar31 << (0xeU - (char)iVar9 & 0x3f)) & 0x3fff) << 4);
    iVar16 = *(int *)((long)pvVar1 + uVar27);
    if ((iVar16 == 0) || (iVar8 = iVar9 - iVar16, iVar9 < iVar16)) goto LAB_0010c86d;
    uVar15 = *(uint *)((long)pvVar1 + uVar27 + 4);
    if (uVar15 == (uint)local_7f8) {
      if (iVar8 < 8) {
        if (local_7d8 <= pbVar24) goto LAB_0010c9e1;
        bVar14 = *pbVar24;
        pbVar24 = pbVar24 + 1;
        uVar31 = uVar31 << 8 | (ulong)bVar14;
        iVar8 = iVar8 + 8;
      }
      iVar9 = iVar8 + -8;
      uVar27 = uVar31 >> ((byte)iVar9 & 0x3f);
      if (puVar2 < puVar26 + (uVar27 & 0xff)) goto LAB_0010c86d;
      if (puVar26 + -1 < local_7e0) goto LAB_0010c9e1;
      uVar3 = puVar26[-1];
      while (cVar7 = (char)uVar27, uVar27 = (ulong)(byte)(cVar7 - 1), cVar7 != '\0') {
        *puVar26 = uVar3;
        puVar26 = puVar26 + 1;
      }
    }
    else {
      if (puVar2 <= puVar26) goto LAB_0010c86d;
      *puVar26 = (uint16_t)uVar15;
      puVar26 = puVar26 + 1;
      iVar9 = iVar8;
    }
  }
  local_80c = (uint)(puVar26 != puVar2);
LAB_0010c86d:
  if (p_Var18 == (exr_const_context_t)0x0) {
    pcVar22 = internal_exr_free;
  }
  else {
    pcVar22 = p_Var18->free_fn;
  }
  for (lVar10 = 0; lVar10 != 0x40000; lVar10 = lVar10 + 0x10) {
    pvVar1 = *(void **)((long)spare + lVar10 + 0x80010);
    if (pvVar1 != (void *)0x0) {
      (*pcVar22)(pvVar1);
      *(undefined8 *)((long)spare + lVar10 + 0x80010) = 0;
    }
  }
  return local_80c;
LAB_0010c866:
  local_80c = 1;
  goto LAB_0010c86d;
LAB_0010c9e1:
  local_80c = 1;
  goto LAB_0010c86d;
}

Assistant:

exr_result_t
internal_huf_decompress (
    exr_decode_pipeline_t* decode,
    const uint8_t*         compressed,
    uint64_t               nCompressed,
    uint16_t*              raw,
    uint64_t               nRaw,
    void*                  spare,
    uint64_t               sparebytes)
{
    uint32_t            im, iM, nBits;
    uint64_t            nBytes;
    const uint8_t*      ptr;
    exr_result_t        rv;
    exr_const_context_t pctxt            = NULL;
    const uint64_t      hufInfoBlockSize = 5 * sizeof (uint32_t);

    if (decode) pctxt = decode->context;
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) return EXR_ERR_INVALID_ARGUMENT;
        return EXR_ERR_SUCCESS;
    }

    if (sparebytes != internal_exr_huf_decompress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    im = readUInt (compressed);
    iM = readUInt (compressed + 4);
    // uint32_t tableLength = readUInt (compressed + 8);
    nBits = readUInt (compressed + 12);
    // uint32_t future = readUInt (compressed + 16);

    if (im >= HUF_ENCSIZE || iM >= HUF_ENCSIZE) return EXR_ERR_CORRUPT_CHUNK;

    ptr = compressed + hufInfoBlockSize;

    nBytes = (((uint64_t) (nBits) + 7)) / 8;

    // must be nBytes remaining in buffer
    if (hufInfoBlockSize + nBytes > nCompressed) return EXR_ERR_OUT_OF_MEMORY;

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //
    if (fasthuf_decode_enabled () && nBits > 128)
    {
        FastHufDecoder* fhd = (FastHufDecoder*) spare;

        rv = fasthuf_initialize (
            pctxt, fhd, &ptr, nCompressed - hufInfoBlockSize, im, iM, (int) iM);
        if (rv == EXR_ERR_SUCCESS)
        {
            if ((uint64_t) (ptr - compressed) + nBytes > nCompressed)
                return EXR_ERR_OUT_OF_MEMORY;
            rv = fasthuf_decode (pctxt, fhd, ptr, nBits, raw, nRaw);
        }
    }
    else
    {
        uint64_t* freq  = (uint64_t*) spare;
        HufDec*   hdec  = (HufDec*) (freq + HUF_ENCSIZE);
        uint64_t  nLeft = nCompressed - 20;

        hufClearDecTable (hdec);
        hufUnpackEncTable (&ptr, &nLeft, im, iM, freq);

        if (nBits > 8 * nLeft) return EXR_ERR_CORRUPT_CHUNK;

        rv = hufBuildDecTable (pctxt, freq, im, iM, hdec);
        if (rv == EXR_ERR_SUCCESS)
            rv = hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);

        hufFreeDecTable (pctxt, hdec);
    }
    return rv;
}